

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans.h
# Opt level: O0

int draco::rabs_desc_read(AnsDecoder *ans,AnsP8 p0)

{
  uint uVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  AnsP8 p;
  uint xn;
  uint x;
  uint rem;
  uint quot;
  int val;
  AnsP8 p0_local;
  AnsDecoder *ans_local;
  
  bVar2 = -p0;
  if ((ans->state < 0x1000) && (0 < ans->buf_offset)) {
    iVar4 = ans->buf_offset + -1;
    ans->buf_offset = iVar4;
    ans->state = ans->state * 0x100 + (uint)ans->buf[iVar4];
  }
  uVar1 = ans->state;
  iVar4 = (uVar1 >> 8) * (uint)bVar2;
  uVar3 = (uint)((uVar1 & 0xff) < (uint)bVar2);
  if (uVar3 == 0) {
    ans->state = (uVar1 - iVar4) - (uint)bVar2;
  }
  else {
    ans->state = iVar4 + (uVar1 & 0xff);
  }
  return uVar3;
}

Assistant:

static inline int rabs_desc_read(struct AnsDecoder *ans, AnsP8 p0) {
  int val;
#if DRACO_ANS_IMPL1
  unsigned l_s;
#else
  unsigned quot, rem, x, xn;
#endif
  const AnsP8 p = DRACO_ANS_P8_PRECISION - p0;
  if (ans->state < DRACO_ANS_L_BASE && ans->buf_offset > 0) {
    ans->state = ans->state * DRACO_ANS_IO_BASE + ans->buf[--ans->buf_offset];
  }
#if DRACO_ANS_IMPL1
  val = ans->state % DRACO_ANS_P8_PRECISION < p;
  l_s = val ? p : p0;
  ans->state = (ans->state / DRACO_ANS_P8_PRECISION) * l_s +
               ans->state % DRACO_ANS_P8_PRECISION - (!val * p);
#else
  x = ans->state;
  quot = x / DRACO_ANS_P8_PRECISION;
  rem = x % DRACO_ANS_P8_PRECISION;
  xn = quot * p;
  val = rem < p;
  if (UNPREDICTABLE(val)) {
    ans->state = xn + rem;
  } else {
    // ans->state = quot * p0 + rem - p;
    ans->state = x - xn - p;
  }
#endif
  return val;
}